

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_1008165::HandleLengthCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  size_t sVar2;
  long lVar3;
  string_view value;
  char buffer [1024];
  allocator<char> local_429;
  string local_428 [1032];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar3 == 0x60) {
    snprintf((char *)local_428,0x400,"%d",(ulong)(uint)pbVar1[1]._M_string_length);
    this = status->Makefile;
    sVar2 = strlen((char *)local_428);
    value._M_str = (char *)local_428;
    value._M_len = sVar2;
    cmMakefile::AddDefinition(this,pbVar1 + 2,value);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_428,"sub-command LENGTH requires two arguments.",&local_429);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string(local_428);
  }
  return lVar3 == 0x60;
}

Assistant:

bool HandleLengthCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("sub-command LENGTH requires two arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  std::vector<std::string> varArgsExpanded;
  // do not check the return value here
  // if the list var is not found varArgsExpanded will have size 0
  // and we will return 0
  GetList(varArgsExpanded, listName, status.GetMakefile());
  size_t length = varArgsExpanded.size();
  char buffer[1024];
  snprintf(buffer, sizeof(buffer), "%d", static_cast<int>(length));

  status.GetMakefile().AddDefinition(variableName, buffer);
  return true;
}